

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O2

void __thiscall slang::ast::TypePrinter::appendMembers(TypePrinter *this,Scope *scope)

{
  VariableSymbol *pVVar1;
  Type *type;
  format_string<const_std::basic_string_view<char>_&> fmt;
  iterator_range<slang::ast::Scope::iterator> iVar2;
  iterator __begin2;
  
  ::fmt::v9::detail::buffer<char>::append<char>
            ((buffer<char> *)
             (this->buffer)._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"{","");
  iVar2 = Scope::members(scope);
  __begin2 = iVar2.m_begin.current;
  while (__begin2.current != iVar2.m_end.current.current) {
    pVVar1 = Symbol::as<slang::ast::VariableSymbol>(__begin2.current);
    type = DeclaredType::getType(&(pVVar1->super_ValueSymbol).declaredType);
    append(this,type);
    fmt.str_.size_ = 4;
    fmt.str_.data_ = " {};";
    FormatBuffer::format<std::basic_string_view<char,std::char_traits<char>>const&>
              ((this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,fmt,
               &(pVVar1->super_ValueSymbol).super_Symbol.name);
    Scope::iterator::operator++(&__begin2);
  }
  ::fmt::v9::detail::buffer<char>::append<char>
            ((buffer<char> *)
             (this->buffer)._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"}","");
  return;
}

Assistant:

void TypePrinter::appendMembers(const Scope& scope) {
    buffer->append("{");
    for (auto& member : scope.members()) {
        auto& var = member.as<VariableSymbol>();
        append(var.getType());
        buffer->format(" {};", var.name);
    }
    buffer->append("}");
}